

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O0

aiMatrix4x4 * __thiscall
Assimp::XGLImporter::ReadTrafo(aiMatrix4x4 *__return_storage_ptr__,XGLImporter *this)

{
  double dVar1;
  bool bVar2;
  float fVar3;
  undefined4 extraout_XMM0_Db;
  aiVector3D aVar4;
  aiVector3t<float> aVar5;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  string *s;
  undefined1 auStack_40 [4];
  float scale;
  aiVector3D position;
  aiVector3D right;
  aiVector3D up;
  aiVector3D forward;
  XGLImporter *this_local;
  
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&up.y);
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&right.y);
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&position.y);
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)auStack_40);
  s._4_4_ = 1.0;
  while (bVar2 = ReadElementUpToClosing(this,"transform"), bVar2) {
    GetElementName_abi_cxx11_(&local_70,this);
    local_50 = &local_70;
    bVar2 = std::operator==(&local_70,"forward");
    if (bVar2) {
      aVar4 = ReadVec3(this);
      forward.x = aVar4.z;
      up._4_8_ = aVar4._0_8_;
    }
    else {
      bVar2 = std::operator==(local_50,"up");
      if (bVar2) {
        aVar4 = ReadVec3(this);
        up.x = aVar4.z;
        right._4_8_ = aVar4._0_8_;
      }
      else {
        bVar2 = std::operator==(local_50,"position");
        if (bVar2) {
          aVar4 = ReadVec3(this);
          position.x = aVar4.z;
          _auStack_40 = aVar4._0_8_;
        }
      }
    }
    bVar2 = std::operator==(local_50,"scale");
    if ((bVar2) && (s._4_4_ = ReadFloat(this), s._4_4_ < 0.0)) {
      LogFunctions<Assimp::XGLImporter>::LogError("found negative scaling in <transform>, ignoring")
      ;
    }
    std::__cxx11::string::~string((string *)&local_70);
  }
  aiMatrix4x4t<float>::aiMatrix4x4t(__return_storage_ptr__);
  fVar3 = aiVector3t<float>::SquareLength((aiVector3t<float> *)&up.y);
  if ((fVar3 < 0.0001) ||
     (fVar3 = aiVector3t<float>::SquareLength((aiVector3t<float> *)&right.y), fVar3 < 0.0001)) {
    LogFunctions<Assimp::XGLImporter>::LogError
              ("A direction vector in <transform> is zero, ignoring trafo");
  }
  else {
    aiVector3t<float>::Normalize((aiVector3t<float> *)&up.y);
    aiVector3t<float>::Normalize((aiVector3t<float> *)&right.y);
    aVar5 = operator^((aiVector3t<float> *)&up.y,(aiVector3t<float> *)&right.y);
    right.x = aVar5.z;
    position._4_8_ = aVar5._0_8_;
    fVar3 = ::operator*((aiVector3t<float> *)&right.y,(aiVector3t<float> *)&up.y);
    dVar1 = std::fabs((double)CONCAT44(extraout_XMM0_Db,fVar3));
    if (SUB84(dVar1,0) <= 0.0001) {
      aiVector3t<float>::operator*=((aiVector3t<float> *)&position.y,s._4_4_);
      aiVector3t<float>::operator*=((aiVector3t<float> *)&right.y,s._4_4_);
      aiVector3t<float>::operator*=((aiVector3t<float> *)&up.y,s._4_4_);
      __return_storage_ptr__->a1 = position.y;
      __return_storage_ptr__->b1 = position.z;
      __return_storage_ptr__->c1 = right.x;
      __return_storage_ptr__->a2 = right.y;
      __return_storage_ptr__->b2 = right.z;
      __return_storage_ptr__->c2 = up.x;
      __return_storage_ptr__->a3 = up.y;
      __return_storage_ptr__->b3 = up.z;
      __return_storage_ptr__->c3 = forward.x;
      __return_storage_ptr__->a4 = (float)auStack_40;
      __return_storage_ptr__->b4 = scale;
      __return_storage_ptr__->c4 = position.x;
    }
    else {
      LogFunctions<Assimp::XGLImporter>::LogError
                ("<forward> and <up> vectors in <transform> are skewing, ignoring trafo");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

aiMatrix4x4 XGLImporter::ReadTrafo()
{
    aiVector3D forward, up, right, position;
    float scale = 1.0f;

    while (ReadElementUpToClosing("transform")) {
        const std::string& s = GetElementName();
        if (s == "forward") {
            forward = ReadVec3();
        }
        else if (s == "up") {
            up = ReadVec3();
        }
        else if (s == "position") {
            position = ReadVec3();
        }
        if (s == "scale") {
            scale = ReadFloat();
            if(scale < 0.f) {
                // this is wrong, but we can leave the value and pass it to the caller
                LogError("found negative scaling in <transform>, ignoring");
            }
        }
    }

    aiMatrix4x4 m;
    if(forward.SquareLength() < 1e-4 || up.SquareLength() < 1e-4) {
        LogError("A direction vector in <transform> is zero, ignoring trafo");
        return m;
    }

    forward.Normalize();
    up.Normalize();

    right = forward ^ up;
    if (std::fabs(up * forward) > 1e-4) {
        // this is definitely wrong - a degenerate coordinate space ruins everything
        // so substitute identity transform.
        LogError("<forward> and <up> vectors in <transform> are skewing, ignoring trafo");
        return m;
    }

    right *= scale;
    up *= scale;
    forward *= scale;

    m.a1 = right.x;
    m.b1 = right.y;
    m.c1 = right.z;

    m.a2 = up.x;
    m.b2 = up.y;
    m.c2 = up.z;

    m.a3 = forward.x;
    m.b3 = forward.y;
    m.c3 = forward.z;

    m.a4 = position.x;
    m.b4 = position.y;
    m.c4 = position.z;

    return m;
}